

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O1

void __thiscall Rml::ElementText::~ElementText(ElementText *this)

{
  ~ElementText(this);
  operator_delete(this,0x1f8);
  return;
}

Assistant:

ElementText::~ElementText() {}